

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

NeuralNetworkClassifier * __thiscall
CoreML::Specification::Model::mutable_neuralnetworkclassifier(Model *this)

{
  NeuralNetworkClassifier *this_00;
  
  if (this->_oneof_case_[0] == 0x193) {
    this_00 = (NeuralNetworkClassifier *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x193;
    this_00 = (NeuralNetworkClassifier *)operator_new(0x68);
    NeuralNetworkClassifier::NeuralNetworkClassifier(this_00);
    (this->Type_).neuralnetworkclassifier_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::NeuralNetworkClassifier* Model::mutable_neuralnetworkclassifier() {
  if (!has_neuralnetworkclassifier()) {
    clear_Type();
    set_has_neuralnetworkclassifier();
    Type_.neuralnetworkclassifier_ = new ::CoreML::Specification::NeuralNetworkClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.neuralNetworkClassifier)
  return Type_.neuralnetworkclassifier_;
}